

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O1

_Bool tval_is_melee_weapon_k(object_kind *kind)

{
  return (uint)(kind->tval + L'\xfffffffa') < 4;
}

Assistant:

bool tval_is_melee_weapon_k(const struct object_kind *kind)
{
	switch (kind->tval) {
		case TV_SWORD:
		case TV_HAFTED:
		case TV_POLEARM:
		case TV_DIGGING:
			return true;
		default:
			return false;
	}
}